

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_client_open(archive_write_filter *f)

{
  long lVar1;
  int iVar2;
  size_t *__ptr;
  void *__ptr_00;
  long in_RDI;
  size_t buffer_size;
  void *buffer;
  archive_none *state;
  archive_write *a;
  archive *in_stack_ffffffffffffffd8;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 8);
  iVar2 = archive_write_get_bytes_per_block(in_stack_ffffffffffffffd8);
  *(int *)(in_RDI + 0x54) = iVar2;
  iVar2 = archive_write_get_bytes_in_last_block(in_stack_ffffffffffffffd8);
  *(int *)(in_RDI + 0x58) = iVar2;
  iVar2 = *(int *)(in_RDI + 0x54);
  __ptr = (size_t *)calloc(1,0x20);
  __ptr_00 = malloc((long)iVar2);
  if ((__ptr == (size_t *)0x0) || (__ptr_00 == (void *)0x0)) {
    free(__ptr);
    free(__ptr_00);
    archive_set_error(*(archive **)(in_RDI + 8),0xc,"Can\'t allocate data for output buffering");
    local_4 = -0x1e;
  }
  else {
    *__ptr = (long)iVar2;
    __ptr[2] = (size_t)__ptr_00;
    __ptr[3] = __ptr[2];
    __ptr[1] = *__ptr;
    *(size_t **)(in_RDI + 0x40) = __ptr;
    if (*(long *)(lVar1 + 0x98) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = (**(code **)(lVar1 + 0x98))
                          (*(undefined8 *)(in_RDI + 8),*(undefined8 *)(lVar1 + 0xb0));
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_client_open(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state;
	void *buffer;
	size_t buffer_size;

	f->bytes_per_block = archive_write_get_bytes_per_block(f->archive);
	f->bytes_in_last_block =
	    archive_write_get_bytes_in_last_block(f->archive);
	buffer_size = f->bytes_per_block;

	state = (struct archive_none *)calloc(1, sizeof(*state));
	buffer = (char *)malloc(buffer_size);
	if (state == NULL || buffer == NULL) {
		free(state);
		free(buffer);
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for output buffering");
		return (ARCHIVE_FATAL);
	}

	state->buffer_size = buffer_size;
	state->buffer = buffer;
	state->next = state->buffer;
	state->avail = state->buffer_size;
	f->data = state;

	if (a->client_opener == NULL)
		return (ARCHIVE_OK);
	return (a->client_opener(f->archive, a->client_data));
}